

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

void Kit_DsdCompSort(int *pPrios,uint *uSupps,unsigned_short *piLits,int nVars,uint *piLitsRes)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  int Priority [16];
  int pOrder [16];
  int nSuppSizes [16];
  int local_f8 [16];
  int local_b8 [16];
  int aiStack_78 [18];
  
  if (nVars < 1) {
    Extra_BubbleSort(local_b8,local_f8,nVars,0);
  }
  else {
    uVar9 = (ulong)(uint)nVars;
    uVar3 = 0;
    do {
      uVar7 = uSupps[uVar3];
      if (uVar7 == 0) {
        __assert_fail("uSupps[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                      ,0x5d8,
                      "void Kit_DsdCompSort(int *, unsigned int *, unsigned short *, int, unsigned int *)"
                     );
      }
      local_b8[uVar3] = (int)uVar3;
      local_f8[uVar3] = 100000000;
      iVar2 = 100000000;
      lVar8 = 0;
      do {
        if ((uVar7 >> ((uint)lVar8 & 0x1f) & 1) != 0) {
          if (pPrios[lVar8] <= iVar2) {
            iVar2 = pPrios[lVar8];
          }
          local_f8[uVar3] = iVar2;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x10);
      if (iVar2 == 0x10) {
        __assert_fail("Priority[i] != 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                      ,0x5de,
                      "void Kit_DsdCompSort(int *, unsigned int *, unsigned short *, int, unsigned int *)"
                     );
      }
      uVar7 = (uVar7 >> 1 & 0x55555555) + (uVar7 & 0x55555555);
      uVar7 = (uVar7 >> 2 & 0x33333333) + (uVar7 & 0x33333333);
      uVar7 = (uVar7 >> 4 & 0x7070707) + (uVar7 & 0x7070707);
      uVar7 = (uVar7 >> 8 & 0xf000f) + (uVar7 & 0xf000f);
      aiStack_78[uVar3] = (uVar7 >> 0x10) + (uVar7 & 0xffff);
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar9);
    iVar2 = 0;
    Extra_BubbleSort(local_b8,local_f8,nVars,0);
    if (0 < nVars) {
      uVar3 = 0xffffffff;
      uVar5 = 0;
      iVar4 = 0;
      do {
        iVar1 = aiStack_78[uVar5];
        if (iVar4 < iVar1) {
          iVar6 = local_f8[uVar5];
LAB_0055abf3:
          uVar3 = uVar5 & 0xffffffff;
          iVar4 = iVar1;
          iVar2 = iVar6;
        }
        else if ((iVar4 == iVar1) && (iVar6 = local_f8[uVar5], iVar2 < iVar6)) goto LAB_0055abf3;
        uVar5 = uVar5 + 1;
      } while (uVar9 != uVar5);
      iVar2 = (int)uVar3;
      if (iVar2 != -1) {
        *piLitsRes = (uint)piLits[iVar2];
        iVar4 = 1;
        if (0 < nVars) {
          uVar3 = 0;
          do {
            if (local_b8[uVar3] != iVar2) {
              lVar8 = (long)iVar4;
              iVar4 = iVar4 + 1;
              piLitsRes[lVar8] = (uint)piLits[local_b8[uVar3]];
            }
            uVar3 = uVar3 + 1;
          } while (uVar9 != uVar3);
        }
        if (iVar4 == nVars) {
          return;
        }
        __assert_fail("k == nVars",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                      ,0x5fa,
                      "void Kit_DsdCompSort(int *, unsigned int *, unsigned short *, int, unsigned int *)"
                     );
      }
    }
  }
  __assert_fail("iVarBest != -1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                ,0x5f0,
                "void Kit_DsdCompSort(int *, unsigned int *, unsigned short *, int, unsigned int *)"
               );
}

Assistant:

void Kit_DsdCompSort( int pPrios[], unsigned uSupps[], unsigned short * piLits, int nVars, unsigned piLitsRes[] )
{
    int nSuppSizes[16], Priority[16], pOrder[16];
    int i, k, iVarBest, SuppMax, PrioMax;
    // compute support sizes and priorities of the components
    for ( i = 0; i < nVars; i++ )
    {
        assert( uSupps[i] );
        pOrder[i] = i;
        Priority[i] = KIT_INFINITY;
        for ( k = 0; k < 16; k++ )
            if ( uSupps[i] & (1 << k) )
                Priority[i] = KIT_MIN( Priority[i], pPrios[k] );
        assert( Priority[i] != 16 );
        nSuppSizes[i] = Kit_WordCountOnes(uSupps[i]);
    }
    // sort the components by pririty
    Extra_BubbleSort( pOrder, Priority, nVars, 0 );
    // find the component by with largest size and lowest priority
    iVarBest = -1;
    SuppMax  = 0;
    PrioMax  = 0;
    for ( i = 0; i < nVars; i++ )
    {
        if ( SuppMax < nSuppSizes[i] || (SuppMax == nSuppSizes[i] && PrioMax < Priority[i]) )
        {
            SuppMax  = nSuppSizes[i];
            PrioMax  = Priority[i];
            iVarBest = i;
        }
    }
    assert( iVarBest != -1 );
    // copy the resulting literals
    k = 0;
    piLitsRes[k++] = piLits[iVarBest];
    for ( i = 0; i < nVars; i++ )
    {
        if ( pOrder[i] == iVarBest )
            continue;
        piLitsRes[k++] = piLits[pOrder[i]];
    }
    assert( k == nVars );
}